

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::findStabilizationSample
          (UploadWaitDrawCase *this,offset_in_Result_to_deUint64 target,char *description)

{
  pointer *ppuVar1;
  int iVar2;
  pointer pRVar3;
  bool bVar4;
  int iVar5;
  pointer pSVar6;
  int iVar7;
  size_t sVar8;
  int swapNdx;
  int iVar9;
  pointer puVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  pointer pvVar16;
  pointer puVar17;
  ulong uVar18;
  difference_type __d_1;
  pointer pvVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  int local_274;
  int local_248;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  sampleObservations;
  float local_218;
  ThresholdComparer<unsigned_long> local_1f8;
  ulong local_1e8;
  ulong local_1e0;
  pointer local_1d8;
  pointer local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  unsigned_long local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allSamples;
  
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&sampleObservations,(long)(this->m_numMaxSwaps + 1),(allocator_type *)&allSamples);
  for (iVar9 = 0; iVar9 <= this->m_numMaxSwaps; iVar9 = iVar9 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (sampleObservations.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar9,(long)this->m_numSamplesPerSwap);
    pSVar6 = (this->m_samples).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)((long)(this->m_samples).
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 4;
    pRVar3 = (this->m_results).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    uVar18 = uVar13 & 0xffffffff;
    if ((int)uVar13 < 1) {
      uVar18 = uVar12;
    }
    iVar14 = 0;
    for (; uVar18 * 0x28 - uVar12 != 0; uVar12 = uVar12 + 0x28) {
      if (pSVar6->numFrames == iVar9) {
        lVar15 = (long)iVar14;
        iVar14 = iVar14 + 1;
        sampleObservations.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar9].
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar15] =
             *(unsigned_long *)((long)&pRVar3->uploadDuration + uVar12 + target);
      }
      pSVar6 = pSVar6 + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (sampleObservations.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar9].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               sampleObservations.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar9].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_274 = this->m_numMaxSwaps;
  do {
    iVar9 = local_274 + -1;
    if (local_274 == 0) {
      allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
      ppuVar1 = &allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
      std::operator<<((ostream *)ppuVar1,description);
      std::operator<<((ostream *)ppuVar1,": All samples seem to have the same distribution");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&allSamples,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
      local_248 = 0;
      break;
    }
    iVar14 = iVar9;
    do {
      pvVar16 = sampleObservations.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar14 = iVar14 + 1;
      iVar2 = this->m_numMaxSwaps;
      if (iVar2 < iVar14) goto LAB_011939fe;
      uVar18 = (long)sampleObservations.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar9].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)sampleObservations.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar9].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_1e8 = uVar18 >> 3;
      local_1e0 = (ulong)((long)sampleObservations.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar14].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)sampleObservations.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar14].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3;
      iVar5 = (int)local_1e0 + (int)local_1e8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&allSamples,(long)iVar5,(allocator_type *)&local_1f8);
      pvVar19 = pvVar16 + iVar9;
      puVar10 = (pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      sVar8 = (long)(pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar10;
      if (sVar8 != 0) {
        memmove(allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start,puVar10,sVar8);
      }
      pvVar16 = pvVar16 + iVar14;
      puVar10 = (pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      sVar8 = (long)(pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar10;
      if (sVar8 != 0) {
        memmove((void *)(((long)(uVar18 * 0x20000000) >> 0x1d) +
                        (long)allSamples.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start),puVar10,sVar8);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      local_1d0 = (pvVar19->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ulong)((long)(pvVar19->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)local_1d0) >> 3;
      uVar18 = (long)allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      local_1c8 = uVar12 & 0xffffffff;
      if ((int)uVar12 < 1) {
        local_1c8 = 0;
      }
      local_218 = 0.0;
      local_1d8 = allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      uVar12 = 0;
      while (puVar10 = local_1d8, uVar12 != local_1c8) {
        local_1b8 = local_1d0[uVar12];
        local_1f8.relativeThreshold = 0.15;
        local_1f8.absoluteThreshold = 100;
        puVar17 = local_1d8;
        uVar13 = uVar18;
        local_1c0 = uVar12;
        while (uVar12 = uVar13, 0 < (long)uVar12) {
          uVar13 = uVar12 >> 1;
          bVar4 = ThresholdComparer<unsigned_long>::operator()
                            (&local_1f8,puVar17 + uVar13,&local_1b8);
          if (bVar4) {
            puVar17 = puVar17 + uVar13 + 1;
            uVar13 = ~uVar13 + uVar12;
          }
        }
        local_1f8.relativeThreshold = 0.15;
        local_1f8.absoluteThreshold = 100;
        uVar12 = uVar18;
        while (uVar13 = uVar12, 0 < (long)uVar13) {
          uVar12 = uVar13 >> 1;
          bVar4 = ThresholdComparer<unsigned_long>::operator()
                            (&local_1f8,&local_1b8,puVar10 + uVar12);
          if (!bVar4) {
            puVar10 = puVar10 + uVar12 + 1;
            uVar12 = ~uVar12 + uVar13;
          }
        }
        local_218 = local_218 +
                    (float)((int)((ulong)((long)puVar17 - (long)local_1d8) >> 3) + 1 +
                           (int)((ulong)((long)puVar10 - (long)local_1d8) >> 3)) * 0.5;
        uVar12 = local_1c0 + 1;
      }
      iVar7 = (int)local_1e8;
      iVar11 = (int)local_1e0 * iVar7;
      fVar21 = (float)((iVar5 + 1) * iVar11) / 12.0;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      local_218 = (float)(((iVar7 + 1) * iVar7) / 2 + iVar11) - local_218;
      fVar22 = (float)iVar11 - local_218;
      uVar20 = -(uint)(local_218 <= fVar22);
      fVar21 = ((float)iVar11 * -0.5 + (float)(~uVar20 & (uint)fVar22 | (uint)local_218 & uVar20)) /
               fVar21;
      fVar22 = -fVar21;
      if (-fVar21 <= fVar21) {
        fVar22 = fVar21;
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    } while (fVar22 <= 1.96);
    if (local_274 == this->m_numMaxSwaps) {
      allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
      ppuVar1 = &allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
      std::operator<<((ostream *)ppuVar1,description);
      std::operator<<((ostream *)ppuVar1,": Samples with swap count ");
      std::ostream::operator<<(ppuVar1,iVar9);
      std::operator<<((ostream *)ppuVar1," and ");
      std::ostream::operator<<(ppuVar1,iVar14);
      std::operator<<((ostream *)ppuVar1," do not seem to have the same distribution:\n");
      std::operator<<((ostream *)ppuVar1,"\tDifference in standard deviations: ");
      std::ostream::operator<<(ppuVar1,fVar21);
      std::operator<<((ostream *)ppuVar1,"\n");
      std::operator<<((ostream *)ppuVar1,"\tSwap count ");
      std::ostream::operator<<(ppuVar1,iVar9);
      std::operator<<((ostream *)ppuVar1," median: ");
      fVar21 = linearSample<unsigned_long>
                         (sampleObservations.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar9,0.5);
      std::ostream::operator<<(ppuVar1,fVar21);
      std::operator<<((ostream *)ppuVar1,"\n");
      std::operator<<((ostream *)ppuVar1,"\tSwap count ");
      std::ostream::operator<<(ppuVar1,iVar14);
      std::operator<<((ostream *)ppuVar1," median: ");
      fVar21 = linearSample<unsigned_long>
                         (sampleObservations.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar14,0.5);
      std::ostream::operator<<(ppuVar1,fVar21);
      std::operator<<((ostream *)
                      &allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,"\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&allSamples,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)
                 &allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
      local_248 = -1;
    }
    else {
      allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
      ppuVar1 = &allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
      std::operator<<((ostream *)ppuVar1,description);
      std::operator<<((ostream *)ppuVar1,": Samples with swap count ");
      std::ostream::operator<<(ppuVar1,iVar9);
      std::operator<<((ostream *)ppuVar1," and ");
      std::ostream::operator<<(ppuVar1,iVar14);
      std::operator<<((ostream *)ppuVar1," do not seem to have the same distribution:\n");
      std::operator<<((ostream *)ppuVar1,"\tSamples with swap count ");
      std::ostream::operator<<(ppuVar1,iVar9);
      std::operator<<((ostream *)ppuVar1," are not part of the tail of stable results.\n");
      std::operator<<((ostream *)ppuVar1,"\tDifference in standard deviations: ");
      std::ostream::operator<<(ppuVar1,fVar21);
      std::operator<<((ostream *)ppuVar1,"\n");
      std::operator<<((ostream *)ppuVar1,"\tSwap count ");
      std::ostream::operator<<(ppuVar1,iVar9);
      std::operator<<((ostream *)ppuVar1," median: ");
      fVar21 = linearSample<unsigned_long>
                         (sampleObservations.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar9,0.5);
      std::ostream::operator<<(ppuVar1,fVar21);
      std::operator<<((ostream *)ppuVar1,"\n");
      std::operator<<((ostream *)ppuVar1,"\tSwap count ");
      std::ostream::operator<<(ppuVar1,iVar14);
      std::operator<<((ostream *)ppuVar1," median: ");
      fVar21 = linearSample<unsigned_long>
                         (sampleObservations.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar14,0.5);
      std::ostream::operator<<(ppuVar1,fVar21);
      std::operator<<((ostream *)
                      &allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,"\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&allSamples,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)
                 &allSamples.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
      local_248 = local_274;
    }
LAB_011939fe:
    local_274 = iVar9;
  } while (iVar2 < iVar14);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&sampleObservations);
  return local_248;
}

Assistant:

int UploadWaitDrawCase::findStabilizationSample (deUint64 (UploadWaitDrawCase::Result::*target), const char* description)
{
	std::vector<std::vector<deUint64> >	sampleObservations(m_numMaxSwaps+1);
	ThresholdComparer<deUint64>			comparer;

	comparer.relativeThreshold = 0.15f;	// 15%
	comparer.absoluteThreshold = 100;	// (us), assumed sampling precision

	// get observations and order them

	for (int swapNdx = 0; swapNdx <= m_numMaxSwaps; ++swapNdx)
	{
		int insertNdx = 0;

		sampleObservations[swapNdx].resize(m_numSamplesPerSwap);

		for (int ndx = 0; ndx < (int)m_samples.size(); ++ndx)
			if (m_samples[ndx].numFrames == swapNdx)
				sampleObservations[swapNdx][insertNdx++] = m_results[ndx].*target;

		DE_ASSERT(insertNdx == m_numSamplesPerSwap);

		std::sort(sampleObservations[swapNdx].begin(), sampleObservations[swapNdx].end());
	}

	// find stabilization point

	for (int sampleNdx = m_numMaxSwaps-1; sampleNdx != -1; --sampleNdx )
	{
		// Distribution is equal to all following distributions
		for (int cmpTargetDistribution = sampleNdx+1; cmpTargetDistribution <= m_numMaxSwaps; ++cmpTargetDistribution)
		{
			// Stable section ends here?
			const DistributionCompareResult result = distributionCompare(sampleObservations[sampleNdx], sampleObservations[cmpTargetDistribution], comparer);
			if (!result.equal)
			{
				// Last two samples are not equal? Samples never stabilized
				if (sampleNdx == m_numMaxSwaps-1)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< description << ": Samples with swap count " << sampleNdx << " and " << cmpTargetDistribution << " do not seem to have the same distribution:\n"
						<< "\tDifference in standard deviations: " << result.standardDeviations << "\n"
						<< "\tSwap count " << sampleNdx << " median: " << linearSample(sampleObservations[sampleNdx], 0.5f) << "\n"
						<< "\tSwap count " << cmpTargetDistribution << " median: " << linearSample(sampleObservations[cmpTargetDistribution], 0.5f) << "\n"
						<< tcu::TestLog::EndMessage;
					return -1;
				}
				else
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< description << ": Samples with swap count " << sampleNdx << " and " << cmpTargetDistribution << " do not seem to have the same distribution:\n"
						<< "\tSamples with swap count " << sampleNdx << " are not part of the tail of stable results.\n"
						<< "\tDifference in standard deviations: " << result.standardDeviations << "\n"
						<< "\tSwap count " << sampleNdx << " median: " << linearSample(sampleObservations[sampleNdx], 0.5f) << "\n"
						<< "\tSwap count " << cmpTargetDistribution << " median: " << linearSample(sampleObservations[cmpTargetDistribution], 0.5f) << "\n"
						<< tcu::TestLog::EndMessage;

					return sampleNdx+1;
				}
			}
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< description << ": All samples seem to have the same distribution"
		<< tcu::TestLog::EndMessage;

	// all distributions equal
	return 0;
}